

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void OpenSteer::drawBasic3dSphericalVehicle(AbstractVehicle *vehicle,Color *color)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float in_XMM1_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Color color5;
  Color color4;
  Color color3;
  Color color2;
  Color color1;
  Vec3 local_128;
  Vec3 local_118;
  float local_108;
  float fStack_104;
  float local_f8;
  float fStack_f4;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  Color local_c0;
  Color local_b0;
  Color local_a0;
  Color local_90;
  Color local_80;
  Vec3 local_70;
  Vec3 local_60;
  Vec3 local_50;
  Color local_40;
  
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0x18])();
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(vehicle);
  local_e8 = extraout_XMM0_Da_00;
  fStack_e4 = extraout_XMM0_Db;
  fVar3 = in_XMM1_Da;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[6])(vehicle);
  local_108 = extraout_XMM0_Da_01;
  fStack_104 = extraout_XMM0_Db_00;
  fVar4 = fVar3 * extraout_XMM0_Da;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[2])(vehicle);
  fVar1 = fVar4 * extraout_XMM0_Da * 0.5;
  local_f8 = extraout_XMM0_Da_02;
  fStack_f4 = extraout_XMM0_Db_01;
  fVar4 = fVar1;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[4])(vehicle);
  fVar2 = fVar4 * extraout_XMM0_Da * 0.5 * 0.5;
  local_d8 = extraout_XMM0_Da_03;
  fStack_d4 = extraout_XMM0_Db_02;
  fVar4 = fVar2;
  (*(vehicle->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[6])(vehicle);
  local_118.z = fVar3 * extraout_XMM0_Da + in_XMM1_Da;
  local_118.y = fStack_104 * extraout_XMM0_Da + fStack_e4;
  local_118.x = local_108 * extraout_XMM0_Da + local_e8;
  in_XMM1_Da = fVar4 * extraout_XMM0_Da * -0.8660254 + in_XMM1_Da;
  fVar3 = local_f8 * extraout_XMM0_Da * 0.5;
  fVar4 = fStack_f4 * extraout_XMM0_Da * 0.5;
  local_e8 = extraout_XMM0_Da_04 * extraout_XMM0_Da * -0.8660254 + local_e8;
  fStack_e4 = extraout_XMM0_Db_03 * extraout_XMM0_Da * -0.8660254 + fStack_e4;
  local_50.z = in_XMM1_Da - fVar1;
  local_50.y = fStack_e4 - fVar4;
  local_50.x = local_e8 - fVar3;
  local_60.z = fVar1 + in_XMM1_Da;
  local_60.y = fVar4 + fStack_e4;
  local_60.x = fVar3 + local_e8;
  fVar3 = extraout_XMM0_Da * local_d8 * 0.5 * 0.5;
  fVar4 = extraout_XMM0_Da * fStack_d4 * 0.5 * 0.5;
  local_128.z = fVar2 + in_XMM1_Da;
  local_128.y = fVar4 + fStack_e4;
  local_128.x = fVar3 + local_e8;
  local_70.z = in_XMM1_Da - fVar2;
  local_70.y = fStack_e4 - fVar4;
  local_70.x = local_e8 - fVar3;
  Color::Color(&local_90,0.05,0.05,-0.05,1.0);
  local_80 = operator+(color,&local_90);
  Color::Color(&local_a0,0.05,-0.05,0.05,1.0);
  local_90 = operator+(color,&local_a0);
  Color::Color(&local_b0,-0.05,0.05,0.05,1.0);
  local_a0 = operator+(color,&local_b0);
  Color::Color(&local_c0,-0.05,0.05,-0.05,1.0);
  local_b0 = operator+(color,&local_c0);
  Color::Color(&local_40,-0.05,-0.05,0.05,1.0);
  local_c0 = operator+(color,&local_40);
  anon_unknown.dwarf_1ac78::iDrawTriangle(&local_118,&local_50,&local_128,&local_80);
  anon_unknown.dwarf_1ac78::iDrawTriangle(&local_118,&local_128,&local_60,&local_90);
  anon_unknown.dwarf_1ac78::iDrawTriangle(&local_118,&local_70,&local_50,&local_a0);
  anon_unknown.dwarf_1ac78::iDrawTriangle(&local_118,&local_60,&local_70,&local_b0);
  anon_unknown.dwarf_1ac78::iDrawTriangle(&local_50,&local_60,&local_128,&local_c0);
  anon_unknown.dwarf_1ac78::iDrawTriangle(&local_60,&local_50,&local_70,&local_c0);
  return;
}

Assistant:

void 
OpenSteer::drawBasic3dSphericalVehicle (const AbstractVehicle* vehicle,
                                        const Color& color)
{
    // "aspect ratio" of body (as seen from above)
    const float x = 0.5f;
    const float y = sqrtXXX (1 - (x * x));

    // radius and position of vehicle
    const float r = vehicle->radius();
    const Vec3& p = vehicle->position();

    // body shape parameters
    const Vec3 f = r * vehicle->forward();
    const Vec3 s = r * vehicle->side() * x;
    const Vec3 u = r * vehicle->up() * x * 0.5f;
    const Vec3 b = r * vehicle->forward() * -y;

    // vertex positions
    const Vec3 nose   = p + f;
    const Vec3 side1  = p + b - s;
    const Vec3 side2  = p + b + s;
    const Vec3 top    = p + b + u;
    const Vec3 bottom = p + b - u;

    // colors
    const float j = +0.05f;
    const float k = -0.05f;
    const Color color1 = color + Color(j, j, k);
    const Color color2 = color + Color(j, k, j);
    const Color color3 = color + Color(k, j, j);
    const Color color4 = color + Color(k, j, k);
    const Color color5 = color + Color(k, k, j);

    // draw body
    iDrawTriangle (nose,  side1,  top,    color1);  // top, side 1
    iDrawTriangle (nose,  top,    side2,  color2);  // top, side 2
    iDrawTriangle (nose,  bottom, side1,  color3);  // bottom, side 1
    iDrawTriangle (nose,  side2,  bottom, color4);  // bottom, side 2
    iDrawTriangle (side1, side2,  top,    color5);  // top back
    iDrawTriangle (side2, side1,  bottom, color5);  // bottom back
}